

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseGTMCoverage.cxx
# Opt level: O3

bool __thiscall cmParseGTMCoverage::ReadMCovFile(cmParseGTMCoverage *this,char *file)

{
  int *piVar1;
  uint uVar2;
  pointer piVar3;
  cmCTest *pcVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  int iVar10;
  basic_string_view<char,_std::char_traits<char>_> __str;
  int count;
  int linenumber;
  string routine;
  string function;
  string filepath;
  string lastroutine;
  string line;
  string lastpath;
  string lastfunction;
  ostringstream cmCTestLog_msg;
  ifstream in;
  int local_4c0;
  int local_4bc;
  string local_4b8;
  long *local_498;
  long local_488 [2];
  string local_478;
  string local_458;
  long local_438;
  char *local_430;
  _func_int **local_428;
  char local_420;
  undefined7 uStack_41f;
  string local_410;
  key_type local_3f0;
  undefined1 *local_3d0;
  size_t local_3c8;
  undefined1 local_3c0;
  undefined7 uStack_3bf;
  undefined1 local_3b0 [112];
  ios_base local_340 [264];
  long local_238 [4];
  uint auStack_218 [122];
  
  std::ifstream::ifstream(local_238,file,_S_in);
  uVar2 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((uVar2 & 5) == 0) {
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    local_410._M_string_length = 0;
    local_410.field_2._M_local_buf[0] = '\0';
    local_3d0 = &local_3c0;
    local_3c8 = 0;
    local_3c0 = 0;
    local_430 = &local_420;
    local_428 = (_func_int **)0x0;
    local_420 = '\0';
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0._M_string_length = 0;
    local_3f0.field_2._M_local_buf[0] = '\0';
    local_438 = 0;
    while( true ) {
      bVar5 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)local_238,&local_410,(bool *)0x0,0xffffffffffffffff);
      if (!bVar5) break;
      lVar7 = std::__cxx11::string::find((char *)&local_410,0x7dffb8,0);
      if (lVar7 != -1) {
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        local_458._M_string_length = 0;
        local_458.field_2._M_local_buf[0] = '\0';
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        local_478._M_string_length = 0;
        local_478.field_2._M_local_buf[0] = '\0';
        local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
        local_4b8._M_string_length = 0;
        local_4b8.field_2._M_local_buf[0] = '\0';
        local_4bc = 0;
        local_4c0 = 0;
        ParseMCOVLine(this,&local_410,&local_4b8,&local_478,&local_4bc,&local_4c0);
        iVar6 = std::__cxx11::string::compare((char *)&local_4b8);
        if (iVar6 != 0) {
          if (local_478._M_string_length == local_3c8) {
            if (local_478._M_string_length != 0) {
              iVar6 = bcmp(local_478._M_dataplus._M_p,local_3d0,local_478._M_string_length);
              if (iVar6 != 0) goto LAB_00561355;
            }
            if (local_428 == (_func_int **)local_4b8._M_string_length) {
              if (local_428 != (_func_int **)0x0) {
                iVar6 = bcmp(local_430,local_4b8._M_dataplus._M_p,(size_t)local_428);
                if (iVar6 != 0) goto LAB_00561355;
              }
              iVar6 = local_4c0;
              if (local_3f0._M_string_length == 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3b0,"Can not find mumps file : ",0x1a);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_3b0,local_430,(long)local_428);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"  referenced in this line of mcov data:\n[",0x29);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,local_410._M_dataplus._M_p,local_410._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]\n",2);
                pcVar4 = (this->super_cmParseMumpsCoverage).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar4,7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseGTMCoverage.cxx"
                             ,0x53,(char *)local_498,false);
                if (local_498 != local_488) {
                  operator_delete(local_498,local_488[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
                std::ios_base::~ios_base(local_340);
              }
              else {
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::operator[](&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage,
                                      &local_3f0);
                piVar1 = (pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + (long)(int)local_438 + (long)local_4bc;
                *piVar1 = *piVar1 + iVar6;
              }
              goto LAB_00561577;
            }
          }
LAB_00561355:
          bVar5 = cmParseMumpsCoverage::FindMumpsFile
                            (&this->super_cmParseMumpsCoverage,&local_4b8,&local_458);
          if (bVar5) {
LAB_0056136c:
            local_3b0._0_8_ = local_3b0._0_8_ & 0xffffffff00000000;
            bVar5 = FindFunctionInMumpsFile(this,&local_458,&local_478,(int *)local_3b0);
            if (bVar5) {
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage,
                                    &local_458);
              local_438 = (long)(int)local_3b0._0_4_;
              piVar3 = (pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              iVar6 = piVar3[local_4bc + local_438];
              iVar10 = iVar6;
              if (0 < local_4c0) {
                iVar10 = 0;
              }
              if (iVar6 != -1) {
                iVar10 = iVar6;
              }
              piVar3[local_4bc + local_438] = iVar10 + local_4c0;
            }
          }
          else {
            local_3b0._0_8_ = local_4b8._M_string_length;
            local_3b0._8_8_ = local_4b8._M_dataplus._M_p;
            if ((_func_int **)local_4b8._M_string_length != (_func_int **)0x0) {
              __str._M_str = "%";
              __str._M_len = 1;
              iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_3b0,
                                 local_4b8._M_string_length - 1,1,__str);
              if (iVar6 == 0) {
                std::__cxx11::string::erase((ulong)&local_4b8,0);
                bVar5 = cmParseMumpsCoverage::FindMumpsFile
                                  (&this->super_cmParseMumpsCoverage,&local_4b8,&local_458);
                if (bVar5) goto LAB_0056136c;
              }
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b0,"Can not find mumps file : ",0x1a);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_3b0,local_4b8._M_dataplus._M_p,
                                local_4b8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"  referenced in this line of mcov data:\n[",0x29);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_410._M_dataplus._M_p,local_410._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]\n",2);
            pcVar4 = (this->super_cmParseMumpsCoverage).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseGTMCoverage.cxx"
                         ,0x73,(char *)local_498,false);
            if (local_498 != local_488) {
              operator_delete(local_498,local_488[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
            std::ios_base::~ios_base(local_340);
          }
          std::__cxx11::string::_M_assign((string *)&local_3d0);
          std::__cxx11::string::_M_assign((string *)&local_430);
          std::__cxx11::string::_M_assign((string *)&local_3f0);
        }
LAB_00561577:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p,
                          CONCAT71(local_4b8.field_2._M_allocated_capacity._1_7_,
                                   local_4b8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p,
                          CONCAT71(local_478.field_2._M_allocated_capacity._1_7_,
                                   local_478.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,
                          CONCAT71(local_458.field_2._M_allocated_capacity._1_7_,
                                   local_458.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                               local_3f0.field_2._M_local_buf[0]) + 1);
    }
    if (local_430 != &local_420) {
      operator_delete(local_430,CONCAT71(uStack_41f,local_420) + 1);
    }
    if (local_3d0 != &local_3c0) {
      operator_delete(local_3d0,CONCAT71(uStack_3bf,local_3c0) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,
                      CONCAT71(local_410.field_2._M_allocated_capacity._1_7_,
                               local_410.field_2._M_local_buf[0]) + 1);
    }
  }
  std::ifstream::~ifstream(local_238);
  return (uVar2 & 5) == 0;
}

Assistant:

bool cmParseGTMCoverage::ReadMCovFile(const char* file)
{
  cmsys::ifstream in(file);
  if (!in) {
    return false;
  }
  std::string line;
  std::string lastfunction;
  std::string lastroutine;
  std::string lastpath;
  int lastoffset = 0;
  while (cmSystemTools::GetLineFromStream(in, line)) {
    // only look at lines that have coverage data
    if (line.find("^ZZCOVERAGE") == std::string::npos) {
      continue;
    }
    std::string filepath;
    std::string function;
    std::string routine;
    int linenumber = 0;
    int count = 0;
    this->ParseMCOVLine(line, routine, function, linenumber, count);
    // skip this one
    if (routine == "RSEL") {
      continue;
    }
    // no need to search the file if we just did it
    if (function == lastfunction && lastroutine == routine) {
      if (!lastpath.empty()) {
        this->Coverage.TotalCoverage[lastpath][lastoffset + linenumber] +=
          count;
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Can not find mumps file : "
                     << lastroutine
                     << "  referenced in this line of mcov data:\n"
                        "["
                     << line << "]\n");
      }
      continue;
    }
    // Find the full path to the file
    bool found = this->FindMumpsFile(routine, filepath);
    if (!found && cmHasLiteralSuffix(routine, "%")) {
      routine.erase(0, 1);
      found = this->FindMumpsFile(routine, filepath);
    }
    if (found) {
      int lineoffset = 0;
      if (this->FindFunctionInMumpsFile(filepath, function, lineoffset)) {
        cmCTestCoverageHandlerContainer::SingleFileCoverageVector&
          coverageVector = this->Coverage.TotalCoverage[filepath];
        // This section accounts for lines that were previously marked
        // as non-executable code (-1), if the parser comes back with
        // a non-zero count, increase the count by 1 to push the line
        // into the executable code set in addition to the count found.
        if (coverageVector[lineoffset + linenumber] == -1 && count > 0) {
          coverageVector[lineoffset + linenumber] += count + 1;
        } else {
          coverageVector[lineoffset + linenumber] += count;
        }
        lastoffset = lineoffset;
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Can not find mumps file : "
                   << routine
                   << "  referenced in this line of mcov data:\n"
                      "["
                   << line << "]\n");
    }
    lastfunction = function;
    lastroutine = routine;
    lastpath = filepath;
  }
  return true;
}